

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O1

bool IsValidEdgeFaceLink(ON_SubDEdge *edge,ON_SubDFace *face,uint edge_face_index,
                        uint face_edge_index,bool bSilentError)

{
  ushort uVar1;
  bool bVar2;
  byte bVar3;
  ON_SubDFacePtr *pOVar4;
  ON_SubDFace *pOVar5;
  uint uVar6;
  ON_SubDEdgePtr *pOVar7;
  ON_SubDFace *pOVar8;
  ON_SubDFacePtr *pOVar9;
  ulong uVar10;
  ON_SubDEdgePtr *pOVar11;
  ON_SubDEdge *pOVar12;
  ON_SubDFace *pOVar13;
  uint uVar14;
  
  pOVar8 = (ON_SubDFace *)(ulong)edge_face_index;
  if ((((((edge == (ON_SubDEdge *)0x0 || face == (ON_SubDFace *)0x0) ||
         ((edge->super_ON_SubDComponentBase).m_level != (face->super_ON_SubDComponentBase).m_level))
        || (uVar1 = edge->m_face_count, uVar1 == 0)) ||
       ((2 < uVar1 && (edge->m_facex == (ON_SubDFacePtr *)0x0)))) ||
      ((uVar6 = (uint)uVar1, edge_face_index != 0xffffffff && uVar6 <= edge_face_index ||
       (uVar1 = face->m_edge_count, uVar1 == 0)))) ||
     (((4 < uVar1 && (face->m_edgex == (ON_SubDEdgePtr *)0x0)) ||
      (uVar14 = (uint)uVar1, face_edge_index != 0xffffffff && uVar14 <= face_edge_index)))) {
    ON_SubDIncrementErrorCount();
    if (!bSilentError) {
      bVar2 = ON_IsNotValid();
      return bVar2;
    }
    bVar3 = 0;
  }
  else {
    pOVar9 = edge->m_face2;
    bVar2 = true;
    pOVar13 = (ON_SubDFace *)0x0;
    do {
      pOVar4 = pOVar9;
      if ((ON_SubDFace *)0x1 < pOVar13) {
        pOVar4 = edge->m_facex + (long)((long)&pOVar13[-1].m_mesh_fragments + 6);
      }
      pOVar5 = (ON_SubDFace *)(pOVar4->m_ptr & 0xfffffffffffffff8);
      if (pOVar5 == face) {
        if ((int)pOVar8 == -1) {
          pOVar8 = (ON_SubDFace *)((ulong)pOVar13 & 0xffffffff);
        }
        else {
          pOVar5 = pOVar8;
          if (pOVar13 != pOVar8) goto LAB_005da571;
        }
      }
      else {
        pOVar5 = pOVar8;
        if (pOVar13 == pOVar8) {
LAB_005da571:
          ON_SubDIncrementErrorCount();
          if (bSilentError) {
            bVar3 = 0;
          }
          else {
            bVar3 = ON_IsNotValid();
          }
          break;
        }
      }
      bVar3 = (byte)pOVar5;
      pOVar13 = (ON_SubDFace *)((long)&(pOVar13->super_ON_SubDComponentBase).m_subd_point1 + 1);
      bVar2 = pOVar13 < (ON_SubDFace *)(ulong)uVar6;
      pOVar9 = pOVar9 + 1;
    } while ((ON_SubDFace *)(ulong)(uVar6 + (uVar6 == 0)) != pOVar13);
    if (!bVar2) {
      pOVar7 = face->m_edge4;
      uVar10 = 0;
      bVar2 = false;
      do {
        pOVar11 = pOVar7;
        if (uVar10 < 4) {
LAB_005da5c9:
          pOVar12 = (ON_SubDEdge *)(pOVar11->m_ptr & 0xfffffffffffffff8);
        }
        else {
          if (uVar10 < face->m_edge_count) {
            pOVar11 = face->m_edgex + (uVar10 - 4);
            goto LAB_005da5c9;
          }
          pOVar12 = (ON_SubDEdge *)0x0;
        }
        if (pOVar12 == edge) {
          if (face_edge_index == 0xffffffff) {
            face_edge_index = (uint)uVar10;
          }
          else if (uVar10 != face_edge_index) goto LAB_005da607;
        }
        else if (uVar10 == face_edge_index) {
LAB_005da607:
          ON_SubDIncrementErrorCount();
          if (bSilentError) {
            bVar3 = 0;
          }
          else {
            bVar3 = ON_IsNotValid();
          }
          break;
        }
        uVar10 = uVar10 + 1;
        bVar2 = uVar14 <= uVar10;
        pOVar7 = pOVar7 + 1;
      } while (uVar14 + (uVar14 == 0) != uVar10);
      bVar3 = bVar3 | bVar2;
    }
  }
  return (bool)(bVar3 & 1);
}

Assistant:

static bool IsValidEdgeFaceLink(
  const ON_SubDEdge* edge,
  const ON_SubDFace* face,
  unsigned int edge_face_index,
  unsigned int face_edge_index,
  bool bSilentError
  )
{
  if (nullptr == edge || nullptr == face)
    return ON_SubDIsNotValid(bSilentError);

  if (edge->SubdivisionLevel() != face->SubdivisionLevel())
    return ON_SubDIsNotValid(bSilentError);

  const unsigned int edge_face_count = edge->m_face_count;
  if (edge_face_count <= 0)
    return ON_SubDIsNotValid(bSilentError);
  if (edge_face_count > 2 && nullptr == edge->m_facex)
    return ON_SubDIsNotValid(bSilentError);

  if (edge_face_index >= edge_face_count && ON_UNSET_UINT_INDEX != edge_face_index)
    return ON_SubDIsNotValid(bSilentError);

  const unsigned int face_edge_count = face->m_edge_count;
  if (face_edge_count <= 0)
    return ON_SubDIsNotValid(bSilentError);
  if (face_edge_count > 4 && nullptr == face->m_edgex)
    return ON_SubDIsNotValid(bSilentError);

  if (face_edge_index >= face_edge_count && ON_UNSET_UINT_INDEX != face_edge_index)
    return ON_SubDIsNotValid(bSilentError);

  for (unsigned int i = 0; i < edge_face_count; i++)
  {
    if (face == edge->Face(i))
    {
      if (ON_UNSET_UINT_INDEX == edge_face_index)
        edge_face_index = i;
      else if (i != edge_face_index)
        return ON_SubDIsNotValid(bSilentError);
    }
    else if (i == edge_face_index)
    {
      return ON_SubDIsNotValid(bSilentError);
    }
  }

  for (unsigned int i = 0; i < face_edge_count; i++)
  {
    if (edge == face->Edge(i))
    {
      if (ON_UNSET_UINT_INDEX == face_edge_index)
        face_edge_index = i;
      else if (i != face_edge_index)
        return ON_SubDIsNotValid(bSilentError);
    }
    else if (i == face_edge_index)
    {
      return ON_SubDIsNotValid(bSilentError);
    }
  }

  return true;
}